

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_memory.c
# Opt level: O0

int mpt_stream_memory(mpt_stream *stream,iovec *in,iovec *out)

{
  size_t sVar1;
  int *piVar2;
  int local_2c;
  int mode;
  iovec *out_local;
  iovec *in_local;
  mpt_stream *stream_local;
  
  local_2c = 0;
  if ((in == (iovec *)0x0) && (out == (iovec *)0x0)) {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
    return -1;
  }
  _mpt_stream_setfile(&stream->_info,-1,-1);
  mpt_stream_setmode(stream,0);
  if (out != (iovec *)0x0) {
    (stream->_wd).data.base = out->iov_base;
    (stream->_wd).data.max = out->iov_len;
    if (in == (iovec *)0x0) {
      return 1;
    }
    if ((in == out) || ((in->iov_base == out->iov_base && (in->iov_len == out->iov_len)))) {
      (stream->_info)._fd = (stream->_info)._fd | 2;
      return 2;
    }
    local_2c = 1;
  }
  if (in != (iovec *)0x0) {
    (stream->_rd).data.base = in->iov_base;
    sVar1 = in->iov_len;
    (stream->_rd).data.len = sVar1;
    (stream->_rd).data.max = sVar1;
  }
  return local_2c;
}

Assistant:

extern int mpt_stream_memory(MPT_STRUCT(stream) *stream, const struct iovec *in, const struct iovec *out)
{
	int mode = 0;
	
	if (!in && !out) {
		errno = EINVAL;
		return -1;
	}
	_mpt_stream_setfile(&stream->_info, -1, -1);
	mpt_stream_setmode(stream, 0);
	
	if (out) {
		stream->_wd.data.base = out->iov_base;
		stream->_wd.data.max  = out->iov_len;
		if (!in) {
			return MPT_STREAMFLAG(Write);
		}
		if (in == out
		    || ((in->iov_base == out->iov_base) && (in->iov_len == out->iov_len))) {
			stream->_info._fd |= MPT_STREAMFLAG(RdWr);
			return MPT_STREAMFLAG(RdWr);
		}
		mode |= MPT_STREAMFLAG(Write);
	}
	if (in) {
		stream->_rd.data.base = in->iov_base;
		stream->_rd.data.max  = stream->_rd.data.len = in->iov_len;
		mode |= MPT_STREAMFLAG(Read);
	}
	return mode;
}